

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemory.c
# Opt level: O1

void deAlignedFree(void *ptr)

{
  free(ptr);
  return;
}

Assistant:

void deAlignedFree (void* ptr)
{
#if (DE_ALIGNED_MALLOC == DE_ALIGNED_MALLOC_POSIX)
	free(ptr);

#elif (DE_ALIGNED_MALLOC == DE_ALIGNED_MALLOC_WIN32)
	_aligned_free(ptr);

#elif (DE_ALIGNED_MALLOC == DE_ALIGNED_MALLOC_GENERIC)
	if (ptr)
	{
		AlignedAllocHeader* const	hdr	= getAlignedAllocHeader(ptr);

		deFree(hdr->basePtr);
	}
#else
#	error "Invalid DE_ALIGNED_MALLOC"
#endif
}